

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O2

bool __thiscall
llbuild::buildsystem::ShellCommand::configureAttribute
          (ShellCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *this_00;
  pointer pSVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Child *this_01;
  long *S;
  size_t sVar4;
  StringRef value_local;
  StringRef name_local;
  Child local_10d8;
  ulong local_10d0;
  string local_10c0;
  Child local_10a0 [3];
  Twine local_1088;
  Twine local_1070;
  Twine local_1058;
  SmallString<4096U> wd;
  
  sVar4 = value.Length;
  S = (long *)value.Data;
  name_local.Length = name.Length;
  name_local.Data = name.Data;
  value_local.Data = (char *)S;
  value_local.Length = sVar4;
  switch(name_local.Length) {
  case 4:
    if (*(int *)name_local.Data == 0x73677261) {
      this_00 = &this->args;
      pSVar1 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl
          .super__Vector_impl_data._M_finish != pSVar1) {
        (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_finish = pSVar1;
      }
      iVar3 = (*ctx->delegate->_vptr_BuildFileDelegate[2])
                        (ctx->delegate,llbuild::basic::DefaultShellPath_abi_cxx11_,DAT_00208c80);
      wd.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX = (void *)CONCAT44(extraout_var,iVar3);
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
                (this_00,(StringRef *)&wd);
      iVar3 = (*ctx->delegate->_vptr_BuildFileDelegate[2])(ctx->delegate,"-c",2);
      wd.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX = (void *)CONCAT44(extraout_var_00,iVar3);
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
                (this_00,(StringRef *)&wd);
      iVar3 = (*ctx->delegate->_vptr_BuildFileDelegate[2])
                        (ctx->delegate,value_local.Data,value_local.Length);
      wd.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX = (void *)CONCAT44(extraout_var_01,iVar3);
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
                (this_00,(StringRef *)&wd);
    }
    else {
      if (*(int *)name_local.Data != 0x73706564) goto switchD_0014b8b6_caseD_5;
      llvm::
      SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::clear(&(this->depsPaths).
               super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             );
      llvm::SmallVectorImpl<std::__cxx11::string>::emplace_back<llvm::StringRef&>
                ((SmallVectorImpl<std::__cxx11::string> *)&this->depsPaths,&value_local);
    }
    break;
  default:
switchD_0014b8b6_caseD_5:
    bVar2 = ExternalCommand::configureAttribute(&this->super_ExternalCommand,ctx,name,value);
    return bVar2;
  case 9:
    iVar3 = bcmp(name_local.Data,"signature",9);
    if (iVar3 != 0) goto switchD_0014b8b6_caseD_5;
    llvm::StringRef::str_abi_cxx11_((string *)&wd,&value_local);
    std::__cxx11::string::operator=((string *)&this->signatureData,(string *)&wd);
    std::__cxx11::string::_M_dispose();
    break;
  case 10:
    iVar3 = bcmp(name_local.Data,"deps-style",10);
    if (iVar3 != 0) goto switchD_0014b8b6_caseD_5;
    if (sVar4 == 0x24) {
      iVar3 = bcmp(S,"makefile-ignoring-subsequent-outputs",0x24);
      if (iVar3 == 0) {
        this->depsStyle = MakefileIgnoringSubsequentOutputs;
        return true;
      }
    }
    else if (sVar4 == 0xf) {
      iVar3 = bcmp(S,"dependency-info",0xf);
      if (iVar3 == 0) {
        this->depsStyle = DependencyInfo;
        return true;
      }
    }
    else if ((sVar4 == 8) && (*S == 0x656c6966656b616d)) {
      this->depsStyle = Makefile;
      return true;
    }
    llvm::Twine::Twine((Twine *)&local_10c0,"unknown \'deps-style\': \'",&value_local);
    this_01 = &local_10d8;
    llvm::Twine::Twine((Twine *)this_01,"\'");
    goto LAB_0014bd07;
  case 0xb:
    iVar3 = bcmp(name_local.Data,"inherit-env",0xb);
    if (iVar3 != 0) goto switchD_0014b8b6_caseD_5;
    if (sVar4 == 5) {
      iVar3 = bcmp(S,"false",5);
      if (iVar3 != 0) goto LAB_0014bbff;
      bVar2 = false;
    }
    else {
      if ((sVar4 != 4) || ((int)*S != 0x65757274)) goto LAB_0014bbff;
      bVar2 = true;
    }
    this->inheritEnv = bVar2;
    break;
  case 0xf:
    iVar3 = bcmp(name_local.Data,"control-enabled",0xf);
    if (iVar3 != 0) goto switchD_0014b8b6_caseD_5;
    if (sVar4 == 5) {
      iVar3 = bcmp(S,"false",5);
      if (iVar3 == 0) {
        bVar2 = false;
        goto LAB_0014bd2d;
      }
    }
    else if ((sVar4 == 4) && ((int)*S == 0x65757274)) {
      bVar2 = true;
LAB_0014bd2d:
      this->controlEnabled = bVar2;
      return true;
    }
    goto LAB_0014bbff;
  case 0x11:
    iVar3 = bcmp(name_local.Data,"working-directory",0x11);
    if (iVar3 != 0) goto switchD_0014b8b6_caseD_5;
    llvm::SmallVector<char,4096u>::SmallVector<char_const*,void>
              (&wd.super_SmallVector<char,_4096U>,(char *)S,(char *)(sVar4 + (long)S));
    llvm::sys::fs::make_absolute(&wd.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>);
    local_10d0 = wd.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
                 super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
                 0xffffffff;
    local_10d8.twine =
         (Twine *)wd.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
                  super_SmallVectorTemplateBase<char,_true>.
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    llvm::StringRef::str_abi_cxx11_(&local_10c0,(StringRef *)&local_10d8);
    std::__cxx11::string::operator=((string *)&this->workingDirectory,(string *)&local_10c0);
    std::__cxx11::string::_M_dispose();
    llvm::SmallVectorImpl<char>::~SmallVectorImpl
              (&wd.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>);
    break;
  case 0x14:
    iVar3 = bcmp(name_local.Data,"can-safely-interrupt",0x14);
    if (iVar3 != 0) goto switchD_0014b8b6_caseD_5;
    if (sVar4 == 5) {
      iVar3 = bcmp(S,"false",5);
      if (iVar3 == 0) {
        bVar2 = false;
        goto LAB_0014bbbb;
      }
    }
    else if ((sVar4 == 4) && ((int)*S == 0x65757274)) {
      bVar2 = true;
LAB_0014bbbb:
      this->canSafelyInterrupt = bVar2;
      return true;
    }
LAB_0014bbff:
    llvm::Twine::Twine(&local_1058,"invalid value: \'",&value_local);
    llvm::Twine::Twine(&local_1070,"\' for attribute \'");
    llvm::Twine::concat((Twine *)&local_10d8,&local_1058,&local_1070);
    llvm::Twine::Twine(&local_1088,&name_local);
    llvm::Twine::concat((Twine *)&local_10c0,(Twine *)&local_10d8,&local_1088);
    this_01 = local_10a0;
    llvm::Twine::Twine((Twine *)this_01,"\'");
LAB_0014bd07:
    llvm::Twine::concat((Twine *)&wd,(Twine *)&local_10c0,(Twine *)this_01);
    ConfigureContext::error(ctx,(Twine *)&wd);
    return false;
  }
  return true;
}

Assistant:

bool ShellCommand::configureAttribute(const ConfigureContext& ctx, StringRef name,
                                      StringRef value) {
  if (name == "args") {
    // When provided as a scalar string, we default to executing using the
    // shell.
    args.clear();
#if defined(_WIN32)
    args.push_back(ctx.getDelegate().getInternedString(
                       "C:\\windows\\system32\\cmd.exe"));
    args.push_back(ctx.getDelegate().getInternedString("/C"));
#else
    args.push_back(ctx.getDelegate().getInternedString(DefaultShellPath));
    args.push_back(ctx.getDelegate().getInternedString("-c"));
#endif
    args.push_back(ctx.getDelegate().getInternedString(value));
  } else if (name == "signature") {
    signatureData = value;
  } else if (name == "deps") {
    depsPaths.clear();
    depsPaths.emplace_back(value);
  } else if (name == "deps-style") {
    if (value == "makefile") {
      depsStyle = DepsStyle::Makefile;
    } else if (value == "dependency-info") {
      depsStyle = DepsStyle::DependencyInfo;
    } else if (value == "makefile-ignoring-subsequent-outputs") {
      depsStyle = DepsStyle::MakefileIgnoringSubsequentOutputs;
    } else {
      ctx.error("unknown 'deps-style': '" + value + "'");
      return false;
    }
    return true;
  } else if (name == "can-safely-interrupt") {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
                name + "'");
      return false;
    }
    canSafelyInterrupt = value == "true";
  } else if (name == "inherit-env") {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
                name + "'");
      return false;
    }
    inheritEnv = value == "true";
  } else if (name == "working-directory") {
    // Ensure the working directory is absolute. This will make sure any
    // relative directories are interpreted as relative to the CWD at the time
    // the rule is defined.
    SmallString<PATH_MAX> wd = value;
    llvm::sys::fs::make_absolute(wd);
    workingDirectory = StringRef(wd);
  } else if (name == "control-enabled") {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
                name + "'");
      return false;
    }
    controlEnabled = value == "true";
  } else {
    return ExternalCommand::configureAttribute(ctx, name, value);
  }

  return true;
}